

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O0

void __thiscall GrpLexer::mOP_MULT(GrpLexer *this,bool _createToken)

{
  Token *pTVar1;
  byte in_SIL;
  RefCount<Token> *in_RDI;
  RefCount<Token> *pRVar2;
  size_type _begin;
  RefToken _token;
  int _ttype;
  Token *in_stack_ffffffffffffff90;
  Token *in_stack_ffffffffffffff98;
  Token *in_stack_ffffffffffffffa8;
  RefCount<Token> *in_stack_ffffffffffffffb0;
  undefined1 local_38 [24];
  undefined8 local_20;
  RefCount<Token> local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  RefCount<Token>::RefCount(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_20 = std::__cxx11::string::length();
  local_10 = 0x4d;
  (**(code **)&in_RDI->ref[10].count)(in_RDI,0x2a);
  if ((local_9 & 1) != 0) {
    in_stack_ffffffffffffff98 = RefCount::operator_cast_to_Token_((RefCount *)&local_18);
    in_stack_ffffffffffffff90 = RefCount::operator_cast_to_Token_((RefCount *)&nullToken);
    if ((in_stack_ffffffffffffff98 == in_stack_ffffffffffffff90) && (local_10 != -1)) {
      (**(code **)&in_RDI->ref[9].count)(local_38,in_RDI,local_10);
      RefCount<Token>::operator=(in_RDI,(RefCount<Token> *)in_stack_ffffffffffffff98);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_ffffffffffffff90);
      pTVar1 = RefCount<Token>::operator->(&local_18);
      pRVar2 = in_RDI + 1;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffffa8,(ulong)pRVar2);
      (*pTVar1->_vptr_Token[6])(pTVar1,&stack0xffffffffffffffa8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    }
  }
  RefCount<Token>::operator=(in_RDI,(RefCount<Token> *)in_stack_ffffffffffffff98);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void GrpLexer::mOP_MULT(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = OP_MULT;
	
	match(static_cast<unsigned char>('*'));
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}